

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

bool __thiscall Corrade::Utility::Configuration::parse(Configuration *this,StringView in)

{
  StringView fullPath;
  StringView in_00;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  Debug *this_00;
  ostream *output;
  Flags local_e1;
  Error local_e0;
  Flags local_a1;
  Error local_a0;
  BasicStringView<const_char> local_78;
  Configuration *local_68;
  char *local_60;
  undefined1 local_58 [8];
  pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> parsed;
  char *local_38;
  EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U> local_2c;
  Configuration *local_28;
  Configuration *this_local;
  StringView in_local;
  
  in_local._data = (char *)in._sizePlusFlags;
  this_local = (Configuration *)in._data;
  local_28 = this;
  sVar2 = Containers::BasicStringView<const_char>::size((BasicStringView<const_char> *)&this_local);
  if (2 < sVar2) {
    pcVar3 = Containers::BasicStringView<const_char>::operator[]
                       ((BasicStringView<const_char> *)&this_local,0);
    if (*pcVar3 == -0x11) {
      pcVar3 = Containers::BasicStringView<const_char>::operator[]
                         ((BasicStringView<const_char> *)&this_local,1);
      if (*pcVar3 == -0x45) {
        pcVar3 = Containers::BasicStringView<const_char>::operator[]
                           ((BasicStringView<const_char> *)&this_local,2);
        if (*pcVar3 == -0x41) {
          Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::EnumSet
                    (&local_2c,HasBom);
          Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::
          operator|=(&this->_flags,local_2c);
          join_0x00000010_0x00000000_ =
               Containers::BasicStringView<const_char>::exceptPrefix
                         ((BasicStringView<const_char> *)&this_local,3);
          this_local = (Configuration *)parsed.second;
          in_local._data = local_38;
        }
      }
    }
  }
  local_68 = this_local;
  local_60 = in_local._data;
  Containers::BasicStringView<const_char>::BasicStringView(&local_78);
  in_00._sizePlusFlags = (size_t)local_60;
  in_00._data = (char *)local_68;
  fullPath._sizePlusFlags = local_78._sizePlusFlags;
  fullPath._data = local_78._data;
  parse((pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> *)local_58,this,in_00,
        &this->super_ConfigurationGroup,fullPath);
  if (parsed.first._sizePlusFlags == 0) {
    bVar1 = Containers::BasicStringView<const_char>::isEmpty
                      ((BasicStringView<const_char> *)local_58);
    if (!bVar1) {
      output = Error::defaultOutput();
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_e1);
      Error::Error(&local_e0,output,local_e1);
      Debug::operator<<(&local_e0.super_Debug,
                        "Assertion parsed.first.isEmpty() failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:120"
                       );
      Error::~Error(&local_e0);
      abort();
    }
    in_local._sizePlusFlags._7_1_ = true;
  }
  else {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_a1);
    Error::Error(&local_a0,local_a1);
    this_00 = Debug::operator<<(&local_a0.super_Debug,"Utility::Configuration::Configuration():");
    Debug::operator<<(this_00,(char *)parsed.first._sizePlusFlags);
    Error::~Error(&local_a0);
    ConfigurationGroup::clear(&this->super_ConfigurationGroup);
    in_local._sizePlusFlags._7_1_ = false;
  }
  return in_local._sizePlusFlags._7_1_;
}

Assistant:

bool Configuration::parse(Containers::StringView in) {
    /* Oh, BOM, eww */
    if(in.size() >= 3 && in[0] == Bom[0] && in[1] == Bom[1] && in[2] == Bom[2]) {
        _flags |= InternalFlag::HasBom;
        in = in.exceptPrefix(3);
    }

    /* Parse file */
    std::pair<Containers::StringView, const char*> parsed = parse(in, this, {});
    if(parsed.second) {
        Error() << "Utility::Configuration::Configuration():" << parsed.second;
        clear();
        return false;
    }

    CORRADE_INTERNAL_ASSERT(parsed.first.isEmpty());
    return true;
}